

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_add(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  secp256k1_scalar *in_RDI;
  secp256k1_uint128 t;
  int overflow;
  uint in_stack_ffffffffffffffcc;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  
  secp256k1_u128_from_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,*in_RSI);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,*in_RDX);
  uVar2 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI->d[0] = uVar2;
  secp256k1_u128_rshift((secp256k1_uint128 *)&stack0xffffffffffffffc8,0x40);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RSI[1]);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RDX[1]);
  uVar2 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI->d[1] = uVar2;
  secp256k1_u128_rshift((secp256k1_uint128 *)&stack0xffffffffffffffc8,0x40);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RSI[2]);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RDX[2]);
  uVar2 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI->d[2] = uVar2;
  secp256k1_u128_rshift((secp256k1_uint128 *)&stack0xffffffffffffffc8,0x40);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RSI[3]);
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8,in_RDX[3]);
  uVar2 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  in_RDI->d[3] = uVar2;
  secp256k1_u128_rshift((secp256k1_uint128 *)&stack0xffffffffffffffc8,0x40);
  uVar2 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffc8);
  iVar1 = secp256k1_scalar_check_overflow(in_RDI);
  secp256k1_scalar_reduce(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return (int)uVar2 + iVar1;
}

Assistant:

static int secp256k1_scalar_add(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    int overflow;
    secp256k1_uint128 t;
    secp256k1_u128_from_u64(&t, a->d[0]);
    secp256k1_u128_accum_u64(&t, b->d[0]);
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[1]);
    secp256k1_u128_accum_u64(&t, b->d[1]);
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[2]);
    secp256k1_u128_accum_u64(&t, b->d[2]);
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, a->d[3]);
    secp256k1_u128_accum_u64(&t, b->d[3]);
    r->d[3] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    overflow = secp256k1_u128_to_u64(&t) + secp256k1_scalar_check_overflow(r);
    VERIFY_CHECK(overflow == 0 || overflow == 1);
    secp256k1_scalar_reduce(r, overflow);
    return overflow;
}